

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities
          (FluctuatingChargeConstraints *this)

{
  bool bVar1;
  int iVar2;
  pointer pdVar3;
  pointer ppAVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  Molecule *pMVar8;
  long lVar9;
  pointer ppAVar10;
  pointer ppAVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  Atom *pAVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  MoleculeIterator i;
  MoleculeIterator local_28;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  if (this->hasFlucQ_ == true) {
    local_28._M_node = (_Base_ptr)0x0;
    if (this->constrainRegions_ == true) {
      pdVar3 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar7 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
        *pdVar7 = 0.0;
      }
      pdVar3 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (pdVar7 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1)
      {
        *pdVar7 = 0.0;
      }
    }
    pMVar8 = SimInfo::beginMolecule(this->info_,&local_28);
    dVar19 = 0.0;
    dVar17 = 0.0;
    while (pMVar8 != (Molecule *)0x0) {
      if (pMVar8->constrainTotalCharge_ == false) {
        ppAVar10 = (pMVar8->fluctuatingCharges_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar4 = (pMVar8->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar10 == ppAVar4) {
          pAVar15 = (Atom *)0x0;
        }
        else {
          pAVar15 = *ppAVar10;
        }
        uVar13 = pMVar8->molStamp_->region_;
        bVar1 = this->constrainRegions_;
        piVar5 = (this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        while (ppAVar10 = ppAVar10 + 1, pAVar15 != (Atom *)0x0) {
          dVar16 = *(double *)
                    (*(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQVel.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar15->super_StuntDouble).storage_) +
                    (long)(pAVar15->super_StuntDouble).localIndex_ * 8) * pAVar15->chargeMass_;
          if ((-1 < (int)uVar13 & bVar1) == 0) {
            dVar17 = dVar17 + dVar16;
            dVar19 = dVar19 + pAVar15->chargeMass_;
          }
          else {
            iVar2 = piVar5[uVar13];
            pdVar7[iVar2] = dVar16 + pdVar7[iVar2];
            pdVar3[iVar2] = pAVar15->chargeMass_ + pdVar3[iVar2];
          }
          if (ppAVar10 == ppAVar4) {
            pAVar15 = (Atom *)0x0;
          }
          else {
            pAVar15 = *ppAVar10;
          }
        }
      }
      pMVar8 = SimInfo::nextMolecule(this->info_,&local_28);
    }
    if (this->constrainRegions_ == true) {
      pdVar7 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      for (uVar13 = 0; uVar14 = (ulong)uVar13, uVar14 < (ulong)((long)pdVar3 - (long)pdVar7 >> 3);
          uVar13 = uVar13 + 1) {
        pdVar7[uVar14] = pdVar7[uVar14] / pdVar6[uVar14];
      }
    }
    pMVar8 = SimInfo::beginMolecule(this->info_,&local_28);
    while (pMVar8 != (Molecule *)0x0) {
      if (pMVar8->constrainTotalCharge_ == true) {
        ppAVar10 = (pMVar8->fluctuatingCharges_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar4 = (pMVar8->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        dVar16 = 0.0;
        dVar18 = 0.0;
        ppAVar11 = ppAVar10;
        if (ppAVar10 != ppAVar4) goto LAB_001e4e93;
        pAVar15 = (Atom *)0x0;
        while (pAVar15 != (Atom *)0x0) {
          dVar18 = *(double *)
                    (*(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQVel.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar15->super_StuntDouble).storage_) +
                    (long)(pAVar15->super_StuntDouble).localIndex_ * 8) * pAVar15->chargeMass_ +
                   dVar18;
          dVar16 = dVar16 + pAVar15->chargeMass_;
          ppAVar11 = ppAVar11 + 1;
          pAVar15 = (Atom *)0x0;
          if (ppAVar11 != ppAVar4) {
LAB_001e4e93:
            pAVar15 = *ppAVar11;
          }
        }
        if (ppAVar10 != ppAVar4) goto LAB_001e4edc;
        pAVar15 = (Atom *)0x0;
        while (pAVar15 != (Atom *)0x0) {
          lVar12 = (long)(pAVar15->super_StuntDouble).localIndex_;
          lVar9 = *(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).flucQVel.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (pAVar15->super_StuntDouble).storage_);
          *(double *)(lVar9 + lVar12 * 8) = *(double *)(lVar9 + lVar12 * 8) - dVar18 / dVar16;
          ppAVar10 = ppAVar10 + 1;
          pAVar15 = (Atom *)0x0;
          if (ppAVar10 != ppAVar4) {
LAB_001e4edc:
            pAVar15 = *ppAVar10;
          }
        }
      }
      else {
        lVar9 = (long)pMVar8->molStamp_->region_;
        if ((lVar9 < 0) || (this->constrainRegions_ == false)) {
          ppAVar10 = (pMVar8->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar4 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppAVar10 != ppAVar4) goto LAB_001e4dff;
          pAVar15 = (Atom *)0x0;
          while (pAVar15 != (Atom *)0x0) {
            lVar12 = (long)(pAVar15->super_StuntDouble).localIndex_;
            lVar9 = *(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).flucQVel.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (pAVar15->super_StuntDouble).storage_);
            *(double *)(lVar9 + lVar12 * 8) = *(double *)(lVar9 + lVar12 * 8) - dVar17 / dVar19;
            ppAVar10 = ppAVar10 + 1;
            pAVar15 = (Atom *)0x0;
            if (ppAVar10 != ppAVar4) {
LAB_001e4dff:
              pAVar15 = *ppAVar10;
            }
          }
        }
        else {
          dVar16 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9]];
          ppAVar10 = (pMVar8->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar4 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppAVar10 != ppAVar4) goto LAB_001e4e41;
          pAVar15 = (Atom *)0x0;
          while (pAVar15 != (Atom *)0x0) {
            lVar12 = (long)(pAVar15->super_StuntDouble).localIndex_;
            lVar9 = *(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).flucQVel.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (pAVar15->super_StuntDouble).storage_);
            *(double *)(lVar9 + lVar12 * 8) = *(double *)(lVar9 + lVar12 * 8) - dVar16;
            ppAVar10 = ppAVar10 + 1;
            pAVar15 = (Atom *)0x0;
            if (ppAVar10 != ppAVar4) {
LAB_001e4e41:
              pAVar15 = *ppAVar10;
            }
          }
        }
      }
      pMVar8 = SimInfo::nextMolecule(this->info_,&local_28);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities() {
    if (!initialized_) initialize();
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    RealType flucqP, systemCMom, regionCMom, molCMom, molFlucQMass, flucqW;
    RealType systemChargeMass;

    // accumulate the system fluctuating charge velocities, but we have
    // separate constraints for any charges in defined regions and for
    // molecules with constrained charges:

    systemCMom       = 0.0;
    systemChargeMass = 0.0;
    if (constrainRegions_) {
      std::fill(regionCMom_.begin(), regionCMom_.end(), 0.0);
      std::fill(regionChargeMass_.begin(), regionChargeMass_.end(), 0);
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (!mol->constrainTotalCharge()) {
        int region = mol->getRegion();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          flucqP = atom->getFlucQVel() * atom->getChargeMass();
          if (constrainRegions_ && region >= 0) {
            regionCMom_[regionKeys_[region]] += flucqP;
            regionChargeMass_[regionKeys_[region]] += atom->getChargeMass();
          } else {
            systemCMom += flucqP;
            systemChargeMass += atom->getChargeMass();
          }
        }
      }
    }

#ifdef IS_MPI
    // in parallel, we need to add up the contributions from all
    // processors:
    MPI_Allreduce(MPI_IN_PLACE, &systemCMom, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &systemChargeMass, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);

    if (constrainRegions_) {
      MPI_Allreduce(MPI_IN_PLACE, &regionCMom_[0], regionCMom_.size(),
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &regionChargeMass_[0],
                    regionChargeMass_.size(), MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
    }
#endif

    // divide by the total number of fluctuating charges:
    systemCMom /= systemChargeMass;

    // do the same in the regions:
    if (constrainRegions_) {
      for (unsigned int i = 0; i < regionCMom_.size(); ++i) {
        regionCMom_[i] /= regionChargeMass_[i];
      }
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      molCMom      = 0.0;
      molFlucQMass = 0.0;

      if (mol->constrainTotalCharge()) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          molCMom += atom->getFlucQVel() * atom->getChargeMass();
          molFlucQMass += atom->getChargeMass();
        }
        molCMom /= molFlucQMass;

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          flucqW = atom->getFlucQVel() - molCMom;
          atom->setFlucQVel(flucqW);
        }
      } else {
        int region = mol->getRegion();

        regionCMom = 0.0;
        if (constrainRegions_ && region >= 0) {
          regionCMom = regionCMom_[regionKeys_[region]];

          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            flucqW = atom->getFlucQVel() - regionCMom;
            atom->setFlucQVel(flucqW);
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            flucqW = atom->getFlucQVel() - systemCMom;
            atom->setFlucQVel(flucqW);
          }
        }
      }
    }
  }